

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O2

String * __thiscall
asl::Date::toString(String *__return_storage_ptr__,Date *this,Format fmt,bool utc)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  DateData local_9c;
  String local_80;
  double local_68;
  uint local_5c;
  String s;
  
  dVar4 = this->_t;
  if (NAN(dVar4)) {
    String::String(__return_storage_ptr__,"?");
    return __return_storage_ptr__;
  }
  dVar3 = 0.0;
  if (!utc) {
    local_68 = dVar4;
    dVar3 = localOffset(this);
    dVar4 = local_68;
  }
  calc(&local_9c,dVar4 + dVar3);
  uVar1 = 1;
  if (1 < local_9c.month) {
    uVar1 = local_9c.month;
  }
  uVar2 = 0xc;
  if ((int)uVar1 < 0xc) {
    uVar2 = (ulong)uVar1;
  }
  s.field_2._space[0] = '\0';
  s._size = 0;
  s._len = 0;
  switch(fmt) {
  case LONG:
    String::f(&local_80,"%04i-%02i-%02iT%02i:%02i:%02i",(ulong)(uint)local_9c.year,uVar2,
              (ulong)(uint)local_9c.day,(ulong)(uint)local_9c.hours,(ulong)(uint)local_9c.minutes,
              (ulong)(uint)local_9c.seconds);
    String::operator=(&s,&local_80);
    break;
  case SHORT:
    String::String(&local_80,0xf,"%04i%02i%02iT%02i%02i%02i",(ulong)(uint)local_9c.year,uVar2,
                   (ulong)(uint)local_9c.day,(ulong)(uint)local_9c.hours,
                   (ulong)(uint)local_9c.minutes,(ulong)(uint)local_9c.seconds);
    String::operator=(&s,&local_80);
    break;
  case DATE_ONLY:
    String::String(&local_80,0xc,"%04i-%02i-%02i",(ulong)(uint)local_9c.year,uVar2,
                   (ulong)(uint)local_9c.day);
    String::operator=(&s,&local_80);
    break;
  case HTTP:
    String::f(__return_storage_ptr__,"%s, %02i %s %04i %02i:%02i:%02i GMT",
              &DAT_00141ec0 + *(int *)(&DAT_00141ec0 + (long)local_9c.weekDay * 4),
              (ulong)(uint)local_9c.day,
              &DAT_00141edc + *(int *)(&DAT_00141edc + (ulong)((int)uVar2 - 1) * 4),
              (ulong)(uint)local_9c.year,(ulong)(uint)local_9c.hours,(ulong)(uint)local_9c.minutes,
              (ulong)(uint)local_9c.seconds);
    goto LAB_00139dc0;
  case FULL:
    local_5c = local_9c.day;
    local_68 = (double)(ulong)(uint)local_9c.minutes;
    dVar4 = this->_t;
    dVar3 = floor(dVar4);
    String::f(&local_80,"%04i-%02i-%02iT%02i:%02i:%02i.%03i",(ulong)(uint)local_9c.year,uVar2,
              (ulong)local_5c,(ulong)(uint)local_9c.hours,local_68,(ulong)(uint)local_9c.seconds,
              (long)(int)((dVar4 - dVar3) * 1000.0 + 0.5) % 1000 & 0xffffffff);
    String::operator=(&s,&local_80);
    break;
  default:
    goto switchD_00139bc5_default;
  }
  String::~String(&local_80);
switchD_00139bc5_default:
  if (utc) {
    String::operator+=(&s,'Z');
  }
  String::String(__return_storage_ptr__,&s);
LAB_00139dc0:
  String::~String(&s);
  return __return_storage_ptr__;
}

Assistant:

String Date::toString(Date::Format fmt, bool utc) const
{
	if (_t != _t)
		return "?";
	DateData d = calc(_t + (utc ? 0 : localOffset()));
	d.month = clamp(d.month, 1, 12);
	String   s;
	switch (fmt)
	{
	case LONG:
		s = String::f("%04i-%02i-%02iT%02i:%02i:%02i", d.year, d.month, d.day, d.hours, d.minutes, d.seconds);
		break;
	case FULL:
		s = String::f("%04i-%02i-%02iT%02i:%02i:%02i.%03i", d.year, d.month, d.day, d.hours, d.minutes, d.seconds,
		              int(1000 * fract(_t) + 0.5) % 1000);
		break;
	case SHORT:
		s = String(15, "%04i%02i%02iT%02i%02i%02i", d.year, d.month, d.day, d.hours, d.minutes, d.seconds);
		break;
	case DATE_ONLY:
		s = String(12, "%04i-%02i-%02i", d.year, d.month, d.day);
		break;
	case HTTP:
	{
		const char* wd[] = { "Sun", "Mon", "Tue", "Wed", "Thu", "Fri", "Sat" };
		const char* mn[] = { "Jan", "Feb", "Mar", "Apr", "May", "Jun", "Jul", "Aug", "Sep", "Oct", "Nov", "Dec" };
		return String::f("%s, %02i %s %04i %02i:%02i:%02i GMT", wd[d.weekDay], d.day, mn[d.month - 1], d.year, d.hours, d.minutes,
		                 d.seconds);
	}
	}

	if (utc)
		s += 'Z';

	return s;
}